

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O0

Matcher * StringTestingBuilder::Alt(Matcher *__return_storage_ptr__,Matcher *left,Matcher *right)

{
  bool bVar1;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Matcher *local_20;
  Matcher *right_local;
  Matcher *left_local;
  
  local_20 = right;
  right_local = left;
  left_local = __return_storage_ptr__;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)right);
  bVar1 = std::operator==(&local_40,"(alt ");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_60,(ulong)right);
    std::__cxx11::string::operator=((string *)right,local_60);
    std::__cxx11::string::~string(local_60);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"(alt ",&local_e1);
  std::operator+(&local_c0,&local_e0,left);
  std::operator+(&local_a0,&local_c0," ");
  std::operator+(&local_80,&local_a0,right);
  std::operator+(__return_storage_ptr__,&local_80,")");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  return __return_storage_ptr__;
}

Assistant:

static Matcher Alt(Matcher left, Matcher right) {
    if (right.substr(0, 5) == "(alt ") {
      right = right.substr(5, right.size() - 1 - 5);
    }
    return std::string("(alt ") + left + " " + right + ")";
  }